

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

bool __thiscall
ConvexDecomposition::HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,float *svertices,uint stride,uint *vcount,float *vertices,
          float normalepsilon,float *scale)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int j_1;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  float *p;
  float *pfVar10;
  int j;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float local_70 [4];
  float local_60 [4];
  float local_50 [4];
  float bmax_1 [3];
  float bmin_1 [3];
  float bmax [3];
  float bmin [3];
  
  auVar24._4_60_ = in_register_00001204;
  auVar24._0_4_ = normalepsilon;
  if (svcount != 0) {
    *vcount = 0;
    if (scale != (float *)0x0) {
      scale[0] = 1.0;
      scale[1] = 1.0;
      scale[2] = 1.0;
    }
    bmax_1[0] = 3.4028235e+38;
    bmax_1[1] = 3.4028235e+38;
    bmax_1[2] = 3.4028235e+38;
    local_50[0] = -3.4028235e+38;
    local_50[1] = -3.4028235e+38;
    local_50[2] = -3.4028235e+38;
    iVar6 = 0;
    pfVar10 = svertices;
    do {
      lVar11 = 0;
      do {
        fVar15 = pfVar10[lVar11];
        if (fVar15 < bmax_1[lVar11]) {
          bmax_1[lVar11] = fVar15;
        }
        if (local_50[lVar11] < fVar15) {
          local_50[lVar11] = fVar15;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      pfVar10 = (float *)((long)pfVar10 + (ulong)stride);
      iVar6 = iVar6 + 1;
    } while (iVar6 != svcount + (svcount == 0));
    local_50[0] = local_50[0] - bmax_1[0];
    local_50[1] = local_50[1] - bmax_1[1];
    local_50[2] = local_50[2] - bmax_1[2];
    auVar27 = SUB6416(ZEXT464(0x3f000000),0);
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)bmax_1[0]),ZEXT416((uint)local_50[0]),auVar27);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)bmax_1[1]),ZEXT416((uint)local_50[1]),auVar27);
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)bmax_1[2]),ZEXT416((uint)local_50[2]),auVar27);
    fVar15 = auVar28._0_4_;
    fVar16 = auVar25._0_4_;
    fVar19 = auVar29._0_4_;
    if ((((svcount < 3) || (local_50[0] < 1e-06)) || (local_50[1] < 1e-06)) || (local_50[2] < 1e-06)
       ) {
      auVar25 = SUB6416(ZEXT464(0x358637bd),0);
      uVar3 = vcmpss_avx512f(auVar25,ZEXT416((uint)local_50[0]),1);
      bVar13 = (bool)((byte)uVar3 & 1);
      auVar28 = vminss_avx(ZEXT416((uint)local_50[0]),SUB6416(ZEXT464(0x7f7fffff),0));
      uVar7 = (uint)bVar13 * auVar28._0_4_ + (uint)!bVar13 * 0x7f7fffff;
      auVar28 = vminss_avx(ZEXT416((uint)local_50[1]),ZEXT416(uVar7));
      uVar3 = vcmpss_avx512f(auVar25,ZEXT416((uint)local_50[1]),1);
      bVar13 = (bool)((byte)uVar3 & 1);
      uVar7 = (uint)bVar13 * auVar28._0_4_ + !bVar13 * uVar7;
      uVar3 = vcmpps_avx512vl(ZEXT416((uint)local_50[2]),ZEXT416(uVar7),1);
      uVar2 = vcmpps_avx512vl(auVar25,ZEXT416((uint)local_50[2]),1);
      bVar4 = (byte)uVar2 & (byte)uVar3;
      fVar14 = (float)((uint)(bVar4 & 1) * (int)local_50[2] + !(bool)(bVar4 & 1) * uVar7);
      if ((fVar14 != 3.4028235e+38) || (NAN(fVar14))) {
        fVar14 = fVar14 * 0.05;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)local_50[0]),auVar25,1);
        bVar13 = (bool)((byte)uVar3 & 1);
        fVar17 = (float)((uint)bVar13 * (int)fVar14 + (uint)!bVar13 * (int)local_50[0]);
        uVar3 = vcmpss_avx512f(ZEXT416((uint)local_50[1]),auVar25,1);
        bVar13 = (bool)((byte)uVar3 & 1);
        fVar18 = (float)((uint)bVar13 * (int)fVar14 + (uint)!bVar13 * (int)local_50[1]);
        if (1e-06 <= local_50[2]) {
          fVar14 = local_50[2];
        }
      }
      else {
        fVar18 = 0.01;
        fVar17 = 0.01;
        fVar14 = 0.01;
      }
      fVar1 = fVar15 - fVar17;
      fVar15 = fVar15 + fVar17;
      fVar17 = fVar16 - fVar18;
      fVar16 = fVar16 + fVar18;
      fVar18 = fVar19 - fVar14;
      fVar19 = fVar19 + fVar14;
      *vertices = fVar1;
      vertices[1] = fVar17;
      vertices[2] = fVar18;
      *vcount = 1;
      vertices[3] = fVar15;
      vertices[4] = fVar17;
      vertices[5] = fVar18;
      *vcount = 2;
      vertices[6] = fVar15;
      vertices[7] = fVar16;
      vertices[8] = fVar18;
      *vcount = 3;
      vertices[9] = fVar1;
      vertices[10] = fVar16;
      vertices[0xb] = fVar18;
      *vcount = 4;
      vertices[0xc] = fVar1;
      vertices[0xd] = fVar17;
      vertices[0xe] = fVar19;
      *vcount = 5;
      vertices[0xf] = fVar15;
      vertices[0x10] = fVar17;
      vertices[0x11] = fVar19;
      *vcount = 6;
      vertices[0x12] = fVar15;
      vertices[0x13] = fVar16;
      vertices[0x14] = fVar19;
      *vcount = 7;
      vertices[0x15] = fVar1;
      vertices[0x16] = fVar16;
      vertices[0x17] = fVar19;
    }
    else {
      if (scale != (float *)0x0) {
        *scale = local_50[0];
        scale[1] = local_50[1];
        scale[2] = local_50[2];
        local_50[0] = 1.0 / local_50[0];
        local_50[1] = 1.0 / local_50[1];
        local_50[2] = 1.0 / local_50[2];
        auVar28 = ZEXT416((uint)(fVar15 * local_50[0]));
        auVar25 = ZEXT416((uint)(fVar16 * local_50[1]));
        auVar29 = ZEXT416((uint)(local_50[2] * fVar19));
      }
      uVar7 = *vcount;
      iVar6 = 0;
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      do {
        bVar13 = scale == (float *)0x0;
        auVar20 = vmulss_avx512f(ZEXT416((uint)local_50[2]),ZEXT416((uint)svertices[2]));
        auVar20._0_4_ = (float)((uint)bVar13 * (int)svertices[2] + (uint)!bVar13 * auVar20._0_4_);
        fVar15 = (float)((uint)bVar13 * (int)svertices[1] +
                        (uint)!bVar13 * (int)(svertices[1] * local_50[1]));
        fVar16 = (float)((uint)bVar13 * (int)*svertices +
                        (uint)!bVar13 * (int)(*svertices * local_50[0]));
        uVar5 = 0;
        if (uVar7 != 0) {
          uVar8 = 0;
          uVar9 = 0;
          do {
            uVar12 = uVar8 & 0xffffffff;
            auVar21 = vandps_avx(ZEXT416((uint)(vertices[uVar12] - fVar16)),auVar26);
            fVar19 = auVar24._0_4_;
            fVar14 = auVar21._0_4_;
            if (fVar14 < fVar19) {
              auVar21 = vsubss_avx512f(ZEXT416((uint)vertices[uVar12 + 1]),ZEXT416((uint)fVar15));
              auVar21 = vandps_avx512vl(auVar21,auVar30);
              auVar21 = vucomiss_avx512f(auVar21);
              auVar24 = ZEXT1664(auVar21);
              if (fVar14 < fVar19) {
                auVar21 = vsubss_avx512f(ZEXT416((uint)vertices[uVar12 + 2]),auVar20);
                auVar21 = vandps_avx512vl(auVar21,auVar30);
                auVar21 = vucomiss_avx512f(auVar21);
                auVar24 = ZEXT1664(auVar21);
                if (fVar14 < fVar19) {
                  auVar21 = vsubss_avx512f(ZEXT416((uint)fVar16),auVar28);
                  auVar22 = vsubss_avx512f(ZEXT416((uint)fVar15),auVar25);
                  auVar23 = vsubss_avx512f(auVar20,auVar29);
                  auVar22 = vmulss_avx512f(auVar22,auVar22);
                  auVar21 = vfmadd231ss_avx512f(auVar22,auVar21,auVar21);
                  vfmadd231ss_avx512f(auVar21,auVar23,auVar23);
                  fVar17 = vertices[uVar12 + 1] - auVar25._0_4_;
                  auVar22 = vsubss_avx512f(ZEXT416((uint)vertices[uVar12 + 2]),auVar29);
                  auVar21 = ZEXT416((uint)(vertices[uVar12] - auVar28._0_4_));
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar17)),auVar21,auVar21);
                  auVar21 = vfmadd231ss_avx512f(auVar21,auVar22,auVar22);
                  vucomiss_avx512f(auVar21);
                  uVar5 = uVar9;
                  if (fVar14 < fVar19) {
                    vertices[uVar12] = fVar16;
                    vertices[uVar12 + 1] = fVar15;
                    vertices[uVar12 + 2] = auVar20._0_4_;
                  }
                  break;
                }
              }
            }
            uVar9 = uVar9 + 1;
            uVar8 = uVar8 + 3;
            uVar5 = uVar7;
          } while ((ulong)uVar7 * 3 != uVar8);
        }
        if (uVar5 == uVar7) {
          uVar8 = (ulong)(uVar7 * 3);
          vertices[uVar8] = fVar16;
          vertices[uVar8 + 1] = fVar15;
          vertices[uVar8 + 2] = auVar20._0_4_;
          uVar7 = uVar7 + 1;
          *vcount = uVar7;
        }
        svertices = (float *)((long)svertices + (ulong)stride);
        iVar6 = iVar6 + 1;
      } while (iVar6 != svcount + (svcount == 0));
      local_60[0] = 3.4028235e+38;
      local_60[1] = 3.4028235e+38;
      local_60[2] = 3.4028235e+38;
      local_70[0] = -3.4028235e+38;
      local_70[1] = -3.4028235e+38;
      local_70[2] = -3.4028235e+38;
      uVar7 = *vcount;
      if ((ulong)uVar7 != 0) {
        uVar5 = 0;
        uVar8 = 0;
        do {
          lVar11 = 0;
          do {
            fVar15 = vertices[(ulong)uVar5 + lVar11];
            if (fVar15 < local_60[lVar11]) {
              local_60[lVar11] = fVar15;
            }
            if (local_70[lVar11] < fVar15) {
              local_70[lVar11] = fVar15;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + 3;
        } while (uVar8 != uVar7);
      }
      local_70[0] = local_70[0] - local_60[0];
      local_70[1] = local_70[1] - local_60[1];
      local_70[2] = local_70[2] - local_60[2];
      if (((2 < uVar7) && (1e-06 <= local_70[0])) &&
         ((1e-06 <= local_70[1] && (1e-06 <= local_70[2])))) goto LAB_00933807;
      auVar30 = ZEXT416((uint)local_70[0]);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)local_60[0]),auVar30,auVar27);
      auVar20 = ZEXT416((uint)local_70[1]);
      auVar29 = vfmadd231ss_fma(ZEXT416((uint)local_60[1]),auVar20,auVar27);
      auVar21 = ZEXT416((uint)local_70[2]);
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)local_60[2]),auVar21,auVar27);
      auVar26 = SUB6416(ZEXT464(0x358637bd),0);
      uVar3 = vcmpss_avx512f(auVar26,auVar30,2);
      bVar13 = (bool)((byte)uVar3 & 1);
      auVar28 = vminss_avx(auVar30,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar7 = (uint)bVar13 * auVar28._0_4_ + (uint)!bVar13 * 0x7f7fffff;
      auVar28 = vminss_avx(auVar20,ZEXT416(uVar7));
      uVar3 = vcmpss_avx512f(auVar26,auVar20,2);
      bVar13 = (bool)((byte)uVar3 & 1);
      uVar7 = (uint)bVar13 * auVar28._0_4_ + !bVar13 * uVar7;
      uVar3 = vcmpps_avx512vl(auVar21,ZEXT416(uVar7),1);
      uVar2 = vcmpps_avx512vl(auVar26,auVar21,2);
      bVar4 = (byte)uVar2 & (byte)uVar3;
      fVar15 = (float)((uint)(bVar4 & 1) * (int)local_70[2] + !(bool)(bVar4 & 1) * uVar7);
      if ((fVar15 != 3.4028235e+38) || (NAN(fVar15))) {
        fVar15 = fVar15 * 0.05;
        uVar3 = vcmpss_avx512f(auVar30,auVar26,1);
        bVar13 = (bool)((byte)uVar3 & 1);
        fVar16 = (float)((uint)bVar13 * (int)fVar15 + (uint)!bVar13 * (int)local_70[0]);
        uVar3 = vcmpss_avx512f(auVar20,auVar26,1);
        bVar13 = (bool)((byte)uVar3 & 1);
        fVar19 = (float)((uint)bVar13 * (int)fVar15 + (uint)!bVar13 * (int)local_70[1]);
        if (1e-06 <= local_70[2]) {
          fVar15 = local_70[2];
        }
      }
      else {
        fVar19 = 0.01;
        fVar16 = 0.01;
        fVar15 = 0.01;
      }
      fVar14 = auVar25._0_4_ - fVar16;
      fVar16 = auVar25._0_4_ + fVar16;
      fVar17 = auVar29._0_4_ - fVar19;
      fVar19 = auVar29._0_4_ + fVar19;
      fVar18 = auVar27._0_4_ - fVar15;
      fVar15 = auVar27._0_4_ + fVar15;
      *vcount = 0;
      *vertices = fVar14;
      vertices[1] = fVar17;
      vertices[2] = fVar18;
      *vcount = 1;
      vertices[3] = fVar16;
      vertices[4] = fVar17;
      vertices[5] = fVar18;
      *vcount = 2;
      vertices[6] = fVar16;
      vertices[7] = fVar19;
      vertices[8] = fVar18;
      *vcount = 3;
      vertices[9] = fVar14;
      vertices[10] = fVar19;
      vertices[0xb] = fVar18;
      *vcount = 4;
      vertices[0xc] = fVar14;
      vertices[0xd] = fVar17;
      vertices[0xe] = fVar15;
      *vcount = 5;
      vertices[0xf] = fVar16;
      vertices[0x10] = fVar17;
      vertices[0x11] = fVar15;
      *vcount = 6;
      vertices[0x12] = fVar16;
      vertices[0x13] = fVar19;
      vertices[0x14] = fVar15;
      *vcount = 7;
      vertices[0x15] = fVar14;
      vertices[0x16] = fVar19;
      vertices[0x17] = fVar15;
    }
    *vcount = 8;
  }
LAB_00933807:
  return svcount != 0;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
																const float *svertices,
																unsigned int stride,
																unsigned int &vcount,       // output number of vertices
																float *vertices,                 // location to store the results.
																float  normalepsilon,
																float *scale)
{
	if ( svcount == 0 ) return false;


#define EPSILON 0.000001f /* close enough to consider two floating point numbers to be 'the same'. */

	vcount = 0;

	float recip[3];

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	float bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	float bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const float *p = (const float *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	float dx = bmax[0] - bmin[0];
	float dy = bmax[1] - bmin[1];
	float dz = bmax[2] - bmin[2];

	float center[3];

	center[0] = dx*0.5f + bmin[0];
	center[1] = dy*0.5f + bmin[1];
	center[2] = dz*0.5f + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		float len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = 0.01f; // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * 0.05f; // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * 0.05f;
			if ( dz < EPSILON ) dz = len * 0.05f;
		}

		float x1 = center[0] - dx;
		float x2 = center[0] + dx;

		float y1 = center[1] - dy;
		float y2 = center[1] + dy;

		float z1 = center[2] - dz;
		float z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{

		const float *p = (const float *)vtx;
		vtx+=stride;

		float px = p[0];
		float py = p[1];
		float pz = p[2];

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				float *v = &vertices[j*3];

				float x = v[0];
				float y = v[1];
				float z = v[2];

				float dx = fabsf(x - px );
				float dy = fabsf(y - py );
				float dz = fabsf(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					float dist1 = GetDist(px,py,pz,center);
					float dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
					}

					break;
				}
			}

			if ( j == vcount )
			{
				float *dest = &vertices[vcount*3];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
	if ( 1 )
	{
		float bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		float bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const float *p = &vertices[i*3];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		float dx = bmax[0] - bmin[0];
		float dy = bmax[1] - bmin[1];
		float dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			float cx = dx*0.5f + bmin[0];
			float cy = dy*0.5f + bmin[1];
			float cz = dz*0.5f + bmin[2];

			float len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = 0.01f; // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * 0.05f; // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * 0.05f;
				if ( dz < EPSILON ) dz = len * 0.05f;
			}

			float x1 = cx - dx;
			float x2 = cx + dx;

			float y1 = cy - dy;
			float y2 = cy + dy;

			float z1 = cz - dz;
			float z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}